

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::abort(torrent *this)

{
  undefined1 *puVar1;
  uint uVar2;
  session_interface *psVar3;
  _func_int **pp_Var4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  array<link,_aux::session_interface::num_torrent_lists,_torrent_list_index_t> *this_00;
  torrent_list_index_t i;
  ulong uVar6;
  undefined1 local_88 [32];
  client_data_t local_68;
  _Function_base local_50;
  
  uVar6 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((uint)uVar6 >> 0x1a & 1) == 0) {
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar6 | 0x4000000;
    update_want_peers(this);
    update_want_tick(this);
    update_want_scrape(this);
    update_gauge(this);
    stop_announcing(this);
    psVar3 = (this->super_torrent_hot_members).m_ses;
    (*(psVar3->super_session_logger)._vptr_session_logger[0x1b])(psVar3,this,0xffffffffffffffff);
    if ((this->m_peer_class).m_val != 0) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x32])();
      peer_class_set::remove_class
                (&this->super_peer_class_set,(peer_class_pool *)CONCAT44(extraout_var,iVar5),
                 (peer_class_t)(this->m_peer_class).m_val);
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x32])();
      peer_class_pool::decref
                ((peer_class_pool *)CONCAT44(extraout_var_00,iVar5),
                 (peer_class_t)(this->m_peer_class).m_val);
      (this->m_peer_class).m_val = 0;
    }
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_inactivity_timer);
    log_to_all_peers(this,"aborting");
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)local_88,torrent_aborted,(type *)0x0);
    disconnect_all(this,(error_code *)local_88,bittorrent);
    on_remove_peers(this);
    pp_Var4 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
    ;
    if ((this->m_storage).m_disk_io == (disk_interface *)0x0) {
      iVar5 = (*pp_Var4[5])();
      if ((*(uint *)(CONCAT44(extraout_var_02,iVar5) + 0x68) & 8) != 0) {
        iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_88);
        alert_manager::emplace_alert<libtorrent::cache_flushed_alert,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_03,iVar5),(torrent_handle *)local_88);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
      }
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_88);
      local_68.m_type_ptr = (this->m_userdata).m_type_ptr;
      local_68.m_client_ptr = (this->m_userdata).m_client_ptr;
      alert_manager::
      emplace_alert<libtorrent::torrent_removed_alert,libtorrent::torrent_handle,libtorrent::info_hash_t_const&,libtorrent::client_data_t>
                ((alert_manager *)CONCAT44(extraout_var_04,iVar5),(torrent_handle *)local_88,
                 &this->m_info_hash,&local_68);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    }
    else {
      iVar5 = (*pp_Var4[4])();
      uVar2 = (this->m_storage).m_idx.m_val;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      local_88._0_8_ = on_torrent_aborted;
      local_88._8_8_ =
           (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            )0x0;
      local_88._16_8_ = local_68.m_type_ptr;
      local_88._24_8_ = local_68.m_client_ptr;
      local_68.m_type_ptr = (char *)0x0;
      local_68.m_client_ptr = (void *)0x0;
      ::std::function<void()>::
      function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>))()>,void>
                ((function<void()> *)&local_50,
                 (_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>))()>
                  *)local_88);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x48))
                ((long *)CONCAT44(extraout_var_01,iVar5),uVar2,&local_50);
      ::std::_Function_base::~_Function_base(&local_50);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.m_client_ptr);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
    if ((this->field_0x5db & 2) == 0) {
      inc_stats_counter(this,0xdb,-1);
      this->field_0x5db = this->field_0x5db | 2;
    }
    puVar1 = &(this->super_torrent_hot_members).field_0x4b;
    *puVar1 = *puVar1 & 0xf7;
    this->field_0x600 = this->field_0x600 & 0xfe;
    update_state_list(this);
    this_00 = &this->m_links;
    for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
      if (-1 < *(int *)&this_00->super_array<libtorrent::aux::link,_8UL>) {
        psVar3 = (this->super_torrent_hot_members).m_ses;
        iVar5 = (*(psVar3->super_session_logger)._vptr_session_logger[0x3c])
                          (psVar3,uVar6 & 0xffffffff);
        link::unlink<libtorrent::aux::torrent>
                  ((link *)this_00,
                   (vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var_05,iVar5),
                   (torrent_list_index_t)(int)uVar6);
      }
      this_00 = (array<link,_aux::session_interface::num_torrent_lists,_torrent_list_index_t> *)
                &(this_00->super_array<libtorrent::aux::link,_8UL>).field_0x4;
    }
    puVar1 = &(this->super_torrent_hot_members).field_0x4c;
    *puVar1 = *puVar1 & 0xfe;
  }
  return;
}

Assistant:

void torrent::abort()
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;

		m_abort = true;
		update_want_peers();
		update_want_tick();
		update_want_scrape();
		update_gauge();
		stop_announcing();

		// remove from download queue
		m_ses.set_queue_position(this, queue_position_t{-1});

		if (m_peer_class > peer_class_t{0})
		{
			remove_class(m_ses.peer_classes(), m_peer_class);
			m_ses.peer_classes().decref(m_peer_class);
			m_peer_class = peer_class_t{0};
		}

		m_inactivity_timer.cancel();

#ifndef TORRENT_DISABLE_LOGGING
		log_to_all_peers("aborting");
#endif

		// disconnect all peers and close all
		// files belonging to the torrents
		disconnect_all(errors::torrent_aborted, operation_t::bittorrent);

		// make sure to destruct the peers immediately
		on_remove_peers();
		TORRENT_ASSERT(m_connections.empty());

		// post a message to the main thread to destruct
		// the torrent object from there
		if (m_storage)
		{
			try {
				m_ses.disk_thread().async_stop_torrent(m_storage
					, std::bind(&torrent::on_torrent_aborted, shared_from_this()));
			}
			catch (std::exception const& e)
			{
				TORRENT_UNUSED(e);
				m_storage.reset();
#ifndef TORRENT_DISABLE_LOGGING
				debug_log("Failed to flush disk cache: %s", e.what());
#endif
				// clients may rely on this alert to be posted, so it's probably a
				// good idea to post it here, even though we failed
				// TODO: 3 should this alert have an error code in it?
				if (alerts().should_post<cache_flushed_alert>())
					alerts().emplace_alert<cache_flushed_alert>(get_handle());
			}
			m_ses.deferred_submit_jobs();
		}
		else
		{
			if (alerts().should_post<cache_flushed_alert>())
				alerts().emplace_alert<cache_flushed_alert>(get_handle());
			alerts().emplace_alert<torrent_removed_alert>(get_handle()
				, info_hash(), get_userdata());
		}

		// TODO: 2 abort lookups this torrent has made via the
		// session host resolver interface

		if (!m_apply_ip_filter)
		{
			inc_stats_counter(counters::non_filter_torrents, -1);
			m_apply_ip_filter = true;
		}

		m_paused = false;
		m_auto_managed = false;
		update_state_list();
		for (torrent_list_index_t i{}; i != m_links.end_index(); ++i)
		{
			if (!m_links[i].in_list()) continue;
			m_links[i].unlink(m_ses.torrent_list(i), i);
		}
		// don't re-add this torrent to the state-update list
		m_state_subscription = false;

#if TORRENT_USE_RTC
		if(m_rtc_signaling)
			m_rtc_signaling->close();
#endif
	}